

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

XXH_NAMESPACEXXH_errorcode
XXH_INLINE_XXH64_update(XXH_NAMESPACEXXH64_state_t *state,void *input,size_t len)

{
  ulong uVar1;
  xxh_u64 xVar2;
  xxh_u64 xVar3;
  long in_RDX;
  ulong in_RSI;
  long *in_RDI;
  xxh_u8 *limit;
  xxh_u8 *bEnd;
  xxh_u8 *p;
  xxh_u64 in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  ulong local_28;
  
  if (in_RSI != 0) {
    uVar1 = in_RSI + in_RDX;
    *in_RDI = in_RDX + *in_RDI;
    if ((ulong)*(uint *)(in_RDI + 9) + in_RDX < 0x20) {
      XXH_memcpy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      *(int *)(in_RDI + 9) = (int)in_RDX + (int)in_RDI[9];
    }
    else {
      local_28 = in_RSI;
      if ((int)in_RDI[9] != 0) {
        XXH_memcpy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        xVar3 = in_RDI[1];
        xVar2 = XXH_readLE64((void *)0x2ae5a0);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[1] = xVar3;
        xVar3 = in_RDI[2];
        xVar2 = XXH_readLE64((void *)0x2ae5d9);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[2] = xVar3;
        xVar3 = in_RDI[3];
        xVar2 = XXH_readLE64((void *)0x2ae612);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[3] = xVar3;
        xVar3 = in_RDI[4];
        xVar2 = XXH_readLE64((void *)0x2ae64b);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[4] = xVar3;
        local_28 = in_RSI + (0x20 - (int)in_RDI[9]);
        *(undefined4 *)(in_RDI + 9) = 0;
      }
      if (local_28 + 0x20 <= uVar1) {
        do {
          xVar3 = in_RDI[1];
          xVar2 = XXH_readLE64((void *)0x2ae6c5);
          xVar3 = XXH64_round(xVar3,xVar2);
          in_RDI[1] = xVar3;
          in_stack_ffffffffffffff90 = in_RDI[2];
          xVar3 = XXH_readLE64((void *)0x2ae703);
          xVar3 = XXH64_round(in_stack_ffffffffffffff90,xVar3);
          in_RDI[2] = xVar3;
          in_stack_ffffffffffffff98 = (void *)in_RDI[3];
          xVar3 = XXH_readLE64((void *)0x2ae742);
          xVar3 = XXH64_round((xxh_u64)in_stack_ffffffffffffff98,xVar3);
          in_RDI[3] = xVar3;
          in_stack_ffffffffffffffa0 = (void *)in_RDI[4];
          xVar3 = XXH_readLE64((void *)0x2ae781);
          xVar3 = XXH64_round((xxh_u64)in_stack_ffffffffffffffa0,xVar3);
          in_RDI[4] = xVar3;
          local_28 = local_28 + 0x20;
        } while (local_28 <= uVar1 - 0x20);
      }
      if (local_28 < uVar1) {
        XXH_memcpy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        *(int *)(in_RDI + 9) = (int)uVar1 - (int)local_28;
      }
    }
  }
  return XXH_NAMESPACEXXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH64_update (XXH64_state_t* state, const void* input, size_t len)
{
    if (input==NULL) {
        XXH_ASSERT(len == 0);
        return XXH_OK;
    }

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len += len;

        if (state->memsize + len < 32) {  /* fill in tmp buffer */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, len);
            state->memsize += (xxh_u32)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* tmp buffer is full */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, 32-state->memsize);
            state->v[0] = XXH64_round(state->v[0], XXH_readLE64(state->mem64+0));
            state->v[1] = XXH64_round(state->v[1], XXH_readLE64(state->mem64+1));
            state->v[2] = XXH64_round(state->v[2], XXH_readLE64(state->mem64+2));
            state->v[3] = XXH64_round(state->v[3], XXH_readLE64(state->mem64+3));
            p += 32 - state->memsize;
            state->memsize = 0;
        }

        if (p+32 <= bEnd) {
            const xxh_u8* const limit = bEnd - 32;

            do {
                state->v[0] = XXH64_round(state->v[0], XXH_readLE64(p)); p+=8;
                state->v[1] = XXH64_round(state->v[1], XXH_readLE64(p)); p+=8;
                state->v[2] = XXH64_round(state->v[2], XXH_readLE64(p)); p+=8;
                state->v[3] = XXH64_round(state->v[3], XXH_readLE64(p)); p+=8;
            } while (p<=limit);

        }

        if (p < bEnd) {
            XXH_memcpy(state->mem64, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}